

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O0

FilmHandle
pbrt::FilmHandle::Create
          (string *name,ParameterDictionary *parameters,Float exposureTime,FilterHandle *filter,
          FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  ParameterDictionary *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *in_R9;
  undefined4 in_stack_00000080;
  FilmHandle *film;
  FileLoc *in_stack_000000b8;
  RGBColorSpace *in_stack_000000c0;
  FilterHandle *in_stack_000000c8;
  Float in_stack_000000d4;
  ParameterDictionary *in_stack_000000d8;
  Allocator in_stack_000000e0;
  ParameterDictionary *in_stack_00000130;
  RGBFilm *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  ParameterDictionary *this;
  TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm> args;
  char *in_stack_ffffffffffffff98;
  FileLoc *in_stack_ffffffffffffffa0;
  
  args.bits = (uintptr_t)in_RDI;
  FilmHandle((FilmHandle *)0x6d9f61);
  bVar1 = std::operator==(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
  if (bVar1) {
    FilterHandle::FilterHandle
              ((FilterHandle *)in_stack_ffffffffffffff60,(FilterHandle *)in_stack_ffffffffffffff58);
    ParameterDictionary::ColorSpace(in_RDX);
    RGBFilm::Create((ParameterDictionary *)alloc.memoryResource,name._4_4_,
                    (FilterHandle *)parameters,
                    (RGBColorSpace *)CONCAT44(exposureTime,in_stack_00000080),(FileLoc *)filter,
                    (Allocator)film);
    TaggedPointer<pbrt::RGBFilm>((FilmHandle *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    operator=((FilmHandle *)in_stack_ffffffffffffff60,(FilmHandle *)in_stack_ffffffffffffff58);
  }
  else {
    bVar1 = std::operator==(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
    if (!bVar1) {
      ErrorExit<std::__cxx11::string_const&>
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args.bits);
    }
    this = in_RDX;
    FilterHandle::FilterHandle((FilterHandle *)in_RDX,(FilterHandle *)in_stack_ffffffffffffff58);
    ParameterDictionary::ColorSpace(in_RDX);
    GBufferFilm::Create(in_stack_000000d8,in_stack_000000d4,in_stack_000000c8,in_stack_000000c0,
                        in_stack_000000b8,in_stack_000000e0);
    TaggedPointer<pbrt::GBufferFilm>((FilmHandle *)this,(GBufferFilm *)in_stack_ffffffffffffff58);
    operator=((FilmHandle *)this,(FilmHandle *)in_stack_ffffffffffffff58);
    in_stack_ffffffffffffff98 = in_R9;
  }
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool((TaggedPointer *)in_RDI);
  if (!bVar1) {
    ErrorExit<std::__cxx11::string_const&>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args.bits);
  }
  ParameterDictionary::ReportUnused(in_stack_00000130);
  return (FilmHandle)(TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>)args.bits;
}

Assistant:

FilmHandle FilmHandle::Create(const std::string &name,
                              const ParameterDictionary &parameters, Float exposureTime,
                              FilterHandle filter, const FileLoc *loc, Allocator alloc) {
    FilmHandle film;
    if (name == "rgb")
        film = RGBFilm::Create(parameters, exposureTime, filter, parameters.ColorSpace(),
                               loc, alloc);
    else if (name == "gbuffer")
        film = GBufferFilm::Create(parameters, exposureTime, filter,
                                   parameters.ColorSpace(), loc, alloc);
    else
        ErrorExit(loc, "%s: film type unknown.", name);

    if (!film)
        ErrorExit(loc, "%s: unable to create film.", name);

    parameters.ReportUnused();
    return film;
}